

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O2

Vec_Wrd_t * Lms_GiaDelays(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Vec_Wrd_t *p_00;
  Gia_Obj_t *pGVar5;
  word wVar6;
  word D;
  Vec_Wrd_t *p_01;
  word wVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  word local_50;
  int local_44;
  Vec_Wrd_t *local_40;
  Gia_Man_t *local_38;
  
  p_00 = Vec_WrdAlloc(p->nObjs);
  Vec_WrdPush(p_00,0);
  iVar9 = 1;
  local_40 = p_00;
  local_38 = p;
  do {
    if ((p->nObjs <= iVar9) || (pGVar5 = Gia_ManObj(p,iVar9), pGVar5 == (Gia_Obj_t *)0x0)) {
      p_01 = Vec_WrdAlloc(p->vCos->nSize);
      iVar9 = 0;
      while ((iVar9 < p->vCos->nSize && (pGVar5 = Gia_ManCo(p,iVar9), pGVar5 != (Gia_Obj_t *)0x0)))
      {
        iVar4 = Gia_ObjId(p,pGVar5);
        wVar7 = Vec_WrdEntry(p_00,iVar4);
        Vec_WrdPush(p_01,wVar7);
        iVar9 = iVar9 + 1;
      }
      Vec_WrdFree(p_00);
      return p_01;
    }
    uVar2 = (uint)*(ulong *)pGVar5;
    uVar8 = *(ulong *)pGVar5 & 0x1fffffff;
    if (uVar8 == 0x1fffffff || (int)uVar2 < 0) {
      if ((int)uVar2 < 0 && (int)uVar8 != 0x1fffffff) {
        wVar6 = Vec_WrdEntry(p_00,iVar9 - (uVar2 & 0x1fffffff));
        iVar4 = p->vCis->nSize;
        local_50 = 0;
        iVar10 = 0;
        if (iVar4 < 1) {
          iVar4 = iVar10;
        }
        for (; p = local_38, wVar7 = local_50, p_00 = local_40, iVar4 != iVar10; iVar10 = iVar10 + 1
            ) {
          iVar3 = Lms_DelayGet(wVar6,iVar10);
          if (iVar3 != 0) {
            iVar3 = Lms_DelayGet(wVar6,iVar10);
            Lms_DelaySet(&local_50,iVar10,iVar3 + -1);
          }
        }
      }
      else {
        if ((~uVar2 & 0x9fffffff) != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                        ,0xae,"Vec_Wrd_t *Lms_GiaDelays(Gia_Man_t *)");
        }
        uVar2 = Gia_ObjCioId(pGVar5);
        if (0xf < uVar2) {
          __assert_fail("v >= 0 && v < LMS_VAR_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                        ,0x73,"word Lms_DelayInit(int)");
        }
        wVar7 = 1L << ((byte)(uVar2 << 2) & 0x3f);
      }
    }
    else {
      wVar6 = Vec_WrdEntry(p_00,iVar9 - (uVar2 & 0x1fffffff));
      local_44 = iVar9;
      D = Vec_WrdEntry(p_00,iVar9 - (*(uint *)&pGVar5->field_0x4 & 0x1fffffff));
      iVar4 = p->vCis->nSize;
      local_50 = 0;
      iVar10 = 0;
      if (iVar4 < 1) {
        iVar4 = iVar10;
      }
      for (; p = local_38, wVar7 = local_50, p_00 = local_40, iVar9 = local_44, iVar4 != iVar10;
          iVar10 = iVar10 + 1) {
        uVar1 = Lms_DelayGet(wVar6,iVar10);
        uVar2 = Lms_DelayGet(D,iVar10);
        if (uVar2 < uVar1) {
          uVar2 = uVar1;
        }
        if (uVar2 != 0) {
          if (0xd < uVar2) {
            uVar2 = 0xe;
          }
          Lms_DelaySet(&local_50,iVar10,uVar2 + 1);
        }
      }
    }
    Vec_WrdPush(p_00,wVar7);
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

Vec_Wrd_t * Lms_GiaDelays( Gia_Man_t * p )
{
    Vec_Wrd_t * vDelays, * vResult;
    Gia_Obj_t * pObj;
    int i;
    // compute delay profiles of all objects
    vDelays = Vec_WrdAlloc( Gia_ManObjNum(p) );
    Vec_WrdPush( vDelays, 0 ); // const 0
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Vec_WrdPush( vDelays, Lms_DelayMax( Vec_WrdEntry(vDelays, Gia_ObjFaninId0(pObj, i)), Vec_WrdEntry(vDelays, Gia_ObjFaninId1(pObj, i)), Gia_ManCiNum(p) ) );
        else if ( Gia_ObjIsCo(pObj) )
            Vec_WrdPush( vDelays, Lms_DelayDecrement( Vec_WrdEntry(vDelays, Gia_ObjFaninId0(pObj, i)), Gia_ManCiNum(p) ) );
        else if ( Gia_ObjIsCi(pObj) )
            Vec_WrdPush( vDelays, Lms_DelayInit( Gia_ObjCioId(pObj) ) );
        else assert( 0 );
    }
    // collect delay profiles of COs only
    vResult = Vec_WrdAlloc( Gia_ManCoNum(p) );
    Gia_ManForEachCo( p, pObj, i )
        Vec_WrdPush( vResult, Vec_WrdEntry(vDelays, Gia_ObjId(p, pObj)) );
    Vec_WrdFree( vDelays );
    return vResult;
}